

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O3

void __thiscall pstore::broker::gc_watch_thread::start_vacuum(gc_watch_thread *this,string *db_path)

{
  long lVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  not_null<const_char_*> nVar4;
  const_iterator cVar5;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_2;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar6;
  long *in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  int local_94;
  long *local_90;
  long local_80 [2];
  unique_lock<std::mutex> local_70;
  not_null<const_char_*> local_60;
  not_null<const_char_*> local_58;
  not_null<const_char_*> local_50;
  long *local_48;
  pointer local_40;
  undefined8 local_38;
  
  local_70._M_device = &this->mut_;
  local_70._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_70);
  local_70._M_owns = true;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&this->processes_,db_path);
  if ((_Rb_tree_header *)cVar5._M_node ==
      &(this->processes_).left_._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (db_path->_M_dataplus)._M_p;
    if ((this->processes_).left_._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x32) {
      local_60.ptr_ = pcVar2;
      gsl::not_null<const_char_*>::ensure_invariant(&local_60);
      nVar4.ptr_ = local_60.ptr_;
      pstore::details::log_destinations::__tls_init();
      lVar1 = *in_FS_OFFSET;
      if (*(long *)(lVar1 + -8) != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar6 = *(undefined8 **)(lVar1 + -8);
        puVar3 = (undefined8 *)puVar6[1];
        for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar3; puVar6 = puVar6 + 1) {
          (**(code **)(*(long *)*puVar6 + 0x58))
                    ((long *)*puVar6,6,"Starting GC process for ",nVar4.ptr_);
        }
      }
      vacuumd_path_abi_cxx11_();
      local_48 = local_90;
      local_40 = (db_path->_M_dataplus)._M_p;
      local_38 = 0;
      local_94 = (*this->_vptr_gc_watch_thread[2])(this,&local_48,3);
      bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
      ::set(&this->processes_,db_path,&local_94);
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      LOCK();
      (this->cv_).signal_.super___atomic_base<int>._M_i = -1;
      UNLOCK();
      descriptor_condition_variable::notify_all_no_except(&(this->cv_).cv_);
    }
    else {
      local_58.ptr_ = pcVar2;
      gsl::not_null<const_char_*>::ensure_invariant(&local_58);
      nVar4.ptr_ = local_58.ptr_;
      pstore::details::log_destinations::__tls_init();
      lVar1 = *in_FS_OFFSET;
      if (*(long *)(lVar1 + -8) != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar6 = *(undefined8 **)(lVar1 + -8);
        puVar3 = (undefined8 *)puVar6[1];
        for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar3; puVar6 = puVar6 + 1) {
          (**(code **)(*(long *)*puVar6 + 0x58))
                    ((long *)*puVar6,6,
                     "Maximum number of GC processes are running. Ignoring request for ",nVar4.ptr_)
          ;
        }
      }
    }
  }
  else {
    local_50.ptr_ = (db_path->_M_dataplus)._M_p;
    gsl::not_null<const_char_*>::ensure_invariant(&local_50);
    nVar4.ptr_ = local_50.ptr_;
    pstore::details::log_destinations::__tls_init();
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar6 = *(undefined8 **)(lVar1 + -8);
      puVar3 = (undefined8 *)puVar6[1];
      for (puVar6 = (undefined8 *)*puVar6; puVar6 != puVar3; puVar6 = puVar6 + 1) {
        (**(code **)(*(long *)*puVar6 + 0x58))
                  ((long *)*puVar6,6,"GC process is already running for ",nVar4.ptr_);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_70);
  return;
}

Assistant:

void gc_watch_thread::start_vacuum (std::string const & db_path) {
            std::unique_lock<decltype (mut_)> const lock{mut_};
            if (processes_.presentl (db_path)) {
                log (priority::info, "GC process is already running for ",
                     logger::quoted{db_path.c_str ()});
                return;
            }

            if (processes_.size () >= max_gc_processes) {
                log (priority::info,
                     "Maximum number of GC processes are running. Ignoring request for ",
                     logger::quoted{db_path.c_str ()});
                return;
            }
            log (priority::info, "Starting GC process for ", logger::quoted{db_path.c_str ()});
            processes_.set (db_path,
                            this->spawn ({vacuumd_path ().c_str (), db_path.c_str (), nullptr}));

            // An initial wakeup of the GC-watcher thread in case the child process exited
            // before we had time to install the SIGCHLD signal handler.
            cv_.notify_all (-1);
        }